

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extract_from.hpp
# Opt level: O0

type boost::spirit::traits::
     extract_from<unsigned_short,unsigned_short,boost::spirit::unused_type_const>
               (unsigned_short *attr,unused_type *ctx)

{
  type puVar1;
  unused_type *ctx_local;
  unsigned_short *attr_local;
  
  puVar1 = detail::extract_from<unsigned_short,unsigned_short,boost::spirit::unused_type_const>
                     (attr,ctx);
  return puVar1;
}

Assistant:

inline typename spirit::result_of::extract_from<Exposed, Attribute>::type
    extract_from(Attribute const& attr, Context& ctx
#if (defined(__GNUC__) && (__GNUC__ < 4)) || \
    (defined(__APPLE__) && defined(__INTEL_COMPILER))
      , typename enable_if<traits::not_is_unused<Attribute> >::type*
#endif
    )
    {
        typedef typename mpl::and_<
            traits::is_container<Attribute>
          , traits::not_is_variant<Attribute>
          , traits::not_is_optional<Attribute>
        >::type is_not_wrapped_container;

        return detail::extract_from<Exposed>(attr, ctx
          , is_not_wrapped_container());
    }